

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O3

void Kf_ManSetDefaultPars(Jf_Par_t *pPars)

{
  memset(&pPars->nRoundsEla,0,0xf8);
  pPars->nLutSize = 6;
  pPars->nCutNum = 8;
  pPars->nProcNum = 0;
  pPars->nRounds = 1;
  pPars->nVerbLimit = 5;
  pPars->DelayTarget = -1;
  pPars->fOptEdge = 1;
  pPars->fCutHashing = 0;
  pPars->fVerbose = 0;
  pPars->fCoarsen = 0;
  pPars->fCutMin = 0;
  pPars->fFuncDsd = 0;
  pPars->fGenCnf = 0;
  pPars->nLutSizeMax = 0x10;
  pPars->nCutNumMax = 0x20;
  pPars->nProcNumMax = 0x20;
  return;
}

Assistant:

void Kf_ManSetDefaultPars( Jf_Par_t * pPars )
{
    memset( pPars, 0, sizeof(Jf_Par_t) );
    pPars->nLutSize     =  6;
    pPars->nCutNum      =  8;
    pPars->nProcNum     =  0;
    pPars->nRounds      =  1;
    pPars->nVerbLimit   =  5;
    pPars->DelayTarget  = -1;
    pPars->fAreaOnly    =  0;
    pPars->fOptEdge     =  1; 
    pPars->fCoarsen     =  0;
    pPars->fCutMin      =  0;
    pPars->fFuncDsd     =  0;
    pPars->fGenCnf      =  0;
    pPars->fPureAig     =  0;
    pPars->fCutHashing  =  0;
    pPars->fCutSimple   =  0;
    pPars->fVerbose     =  0;
    pPars->fVeryVerbose =  0;
    pPars->nLutSizeMax  =  KF_LEAF_MAX;
    pPars->nCutNumMax   =  KF_CUT_MAX;
    pPars->nProcNumMax  =  KF_PROC_MAX;
}